

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChArchive.h
# Opt level: O1

void __thiscall
chrono::ChEnumMapper<chrono::ChGlyphs::eCh_GlyphType>::AddMapping
          (ChEnumMapper<chrono::ChGlyphs::eCh_GlyphType> *this,char *name,eCh_GlyphType enumid)

{
  ChEnumNamePair<chrono::ChGlyphs::eCh_GlyphType> mpair;
  allocator local_41;
  value_type local_40;
  
  std::__cxx11::string::string((string *)&local_40,name,&local_41);
  local_40.enumid = enumid;
  std::
  vector<chrono::ChEnumNamePair<chrono::ChGlyphs::eCh_GlyphType>,_std::allocator<chrono::ChEnumNamePair<chrono::ChGlyphs::eCh_GlyphType>_>_>
  ::push_back((this->enummap).
              super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::ChGlyphs::eCh_GlyphType>,_std::allocator<chrono::ChEnumNamePair<chrono::ChGlyphs::eCh_GlyphType>_>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40.name._M_dataplus._M_p != &local_40.name.field_2) {
    operator_delete(local_40.name._M_dataplus._M_p,local_40.name.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void AddMapping(const char* name, Te enumid) {
        ChEnumNamePair<Te> mpair (name, enumid);
        enummap->push_back(mpair);
    }